

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_data.cpp
# Opt level: O2

void __thiscall csguide_webserver::HttpData::CloseTimer(HttpData *this)

{
  element_type *peVar1;
  weak_ptr<csguide_webserver::TimerNode> *this_00;
  shared_ptr<csguide_webserver::TimerNode> tempTimer;
  __shared_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = &this->timer_;
  std::__shared_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,this_00);
  peVar1 = local_20._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  if (peVar1 != (TimerNode *)0x0) {
    std::__shared_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,this_00);
    TimerNode::Deleted(local_20._M_ptr);
    std::__weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return;
}

Assistant:

void HttpData::CloseTimer() {
  // 首先判断Timer是否还在， 有可能已经超时释放
  if (timer_.lock()) {
    std::shared_ptr<TimerNode> tempTimer(timer_.lock());
      tempTimer->Deleted();
    // 断开weak_ptr
    timer_.reset();
  }
}